

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O2

void __thiscall
tcu::App::App(App *this,Platform *platform,Archive *archive,TestLog *log,CommandLine *cmdLine)

{
  TestHierarchyInflater *caseListFilter_00;
  bool bVar1;
  deUint32 dVar2;
  deBool dVar3;
  RunMode RVar4;
  State SVar5;
  char *pcVar6;
  qpWatchDog *pqVar7;
  qpCrashHandler *pqVar8;
  TestContext *pTVar9;
  TestPackageRoot *this_00;
  TestPackageRegistry *packageRegistry;
  TestSessionExecutor *this_01;
  TestNode *pTVar10;
  ostream *poVar11;
  string *psVar12;
  InternalError *this_02;
  TestContext **ppTVar13;
  DefaultHierarchyInflater inflater;
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  TestHierarchyIterator local_78;
  
  this->_vptr_App = (_func_int **)&PTR__App_00c244a8;
  this->m_platform = platform;
  this->m_watchDog = (qpWatchDog *)0x0;
  this->m_crashHandler = (qpCrashHandler *)0x0;
  de::Mutex::Mutex(&this->m_crashLock,0);
  this->m_crashed = false;
  this->m_testCtx = (TestContext *)0x0;
  this->m_testRoot = (TestPackageRoot *)0x0;
  this->m_testExecutor = (TestSessionExecutor *)0x0;
  pcVar6 = qpGetReleaseName();
  dVar2 = qpGetReleaseId();
  tcu::print("dEQP Core %s (0x%08x) starting..\n",pcVar6,(ulong)dVar2);
  pcVar6 = qpGetTargetName();
  tcu::print("  target implementation = \'%s\'\n",pcVar6);
  dVar3 = deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  if (dVar3 == 0) {
    qpPrintf("WARNING: Failed to set floating-point rounding mode!\n");
  }
  RVar4 = CommandLine::getRunMode(cmdLine);
  bVar1 = CommandLine::isWatchDogEnabled(cmdLine);
  if (bVar1) {
    pqVar7 = qpWatchDog_create(onWatchdogTimeout,this,300,0x1e);
    this->m_watchDog = pqVar7;
    if (pqVar7 == (qpWatchDog *)0x0) {
      this_02 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_02,(char *)0x0,
                 "m_watchDog = qpWatchDog_create(onWatchdogTimeout, this, 300, 30)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuApp.cpp"
                 ,0x66);
      goto LAB_0090febf;
    }
  }
  bVar1 = CommandLine::isCrashHandlingEnabled(cmdLine);
  if (bVar1) {
    pqVar8 = qpCrashHandler_create(onCrash,this);
    this->m_crashHandler = pqVar8;
    if (pqVar8 == (qpCrashHandler *)0x0) {
      this_02 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_02,(char *)0x0,"m_crashHandler = qpCrashHandler_create(onCrash, this)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuApp.cpp"
                 ,0x6a);
LAB_0090febf:
      __cxa_throw(this_02,&InternalError::typeinfo,Exception::~Exception);
    }
  }
  pTVar9 = (TestContext *)operator_new(0x60);
  TestContext::TestContext(pTVar9,this->m_platform,archive,log,cmdLine,this->m_watchDog);
  ppTVar13 = &this->m_testCtx;
  *ppTVar13 = pTVar9;
  this_00 = (TestPackageRoot *)operator_new(0x70);
  packageRegistry = TestPackageRegistry::getSingleton();
  TestPackageRoot::TestPackageRoot(this_00,pTVar9,packageRegistry);
  this->m_testRoot = this_00;
  switch(RVar4) {
  case RUNMODE_EXECUTE:
    this_01 = (TestSessionExecutor *)operator_new(0xa8);
    TestSessionExecutor::TestSessionExecutor(this_01,this_00,*ppTVar13);
    this->m_testExecutor = this_01;
    break;
  case RUNMODE_DUMP_XML_CASELIST:
    writeXmlCaselistsToFiles(this_00,*ppTVar13,cmdLine);
    break;
  case RUNMODE_DUMP_TEXT_CASELIST:
    writeTxtCaselistsToFiles(this_00,*ppTVar13,cmdLine);
    break;
  case RUNMODE_DUMP_STDOUT_CASELIST:
    pTVar9 = *ppTVar13;
    DefaultHierarchyInflater::DefaultHierarchyInflater(&inflater,pTVar9);
    CommandLine::createCaseListFilter
              ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&local_78,
               pTVar9->m_cmdLine,pTVar9->m_curArchive);
    caseListFilter_00 = local_78.m_inflater;
    local_78.m_inflater = (TestHierarchyInflater *)0x0;
    caseListFilter.
    super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>.
    m_data.ptr = (CaseListFilter *)caseListFilter_00;
    de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
    ~UniqueBase((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)
                &local_78);
    TestHierarchyIterator::TestHierarchyIterator
              (&local_78,this_00,&inflater.super_TestHierarchyInflater,
               (CaseListFilter *)caseListFilter_00);
    while (SVar5 = TestHierarchyIterator::getState(&local_78), SVar5 != STATE_FINISHED) {
      TestHierarchyIterator::next(&local_78);
      while (pTVar10 = TestHierarchyIterator::getNode(&local_78),
            pTVar10->m_nodeType != NODETYPE_PACKAGE) {
        SVar5 = TestHierarchyIterator::getState(&local_78);
        if (SVar5 == STATE_ENTER_NODE) {
          pTVar10 = TestHierarchyIterator::getNode(&local_78);
          bVar1 = isTestNodeTypeExecutable(pTVar10->m_nodeType);
          pcVar6 = "TEST";
          if (!bVar1) {
            pcVar6 = "GROUP";
          }
          poVar11 = std::operator<<((ostream *)&std::cout,pcVar6);
          poVar11 = std::operator<<(poVar11,": ");
          psVar12 = TestHierarchyIterator::getNodePath_abi_cxx11_(&local_78);
          poVar11 = std::operator<<(poVar11,(string *)psVar12);
          std::operator<<(poVar11,"\n");
        }
        TestHierarchyIterator::next(&local_78);
      }
      TestHierarchyIterator::next(&local_78);
    }
    TestHierarchyIterator::~TestHierarchyIterator(&local_78);
    de::details::
    UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
    ~UniqueBase(&caseListFilter.
                 super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
               );
    DefaultHierarchyInflater::~DefaultHierarchyInflater(&inflater);
  }
  return;
}

Assistant:

App::App (Platform& platform, Archive& archive, TestLog& log, const CommandLine& cmdLine)
	: m_platform		(platform)
	, m_watchDog		(DE_NULL)
	, m_crashHandler	(DE_NULL)
	, m_crashed			(false)
	, m_testCtx			(DE_NULL)
	, m_testRoot		(DE_NULL)
	, m_testExecutor	(DE_NULL)
{
	print("dEQP Core %s (0x%08x) starting..\n", qpGetReleaseName(), qpGetReleaseId());
	print("  target implementation = '%s'\n", qpGetTargetName());

	if (!deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN))
		qpPrintf("WARNING: Failed to set floating-point rounding mode!\n");

	try
	{
		const RunMode	runMode	= cmdLine.getRunMode();

		// Initialize watchdog
		if (cmdLine.isWatchDogEnabled())
			TCU_CHECK_INTERNAL(m_watchDog = qpWatchDog_create(onWatchdogTimeout, this, 300, 30));

		// Initialize crash handler.
		if (cmdLine.isCrashHandlingEnabled())
			TCU_CHECK_INTERNAL(m_crashHandler = qpCrashHandler_create(onCrash, this));

		// Create test context
		m_testCtx = new TestContext(m_platform, archive, log, cmdLine, m_watchDog);

		// Create root from registry
		m_testRoot = new TestPackageRoot(*m_testCtx, TestPackageRegistry::getSingleton());

		// \note No executor is created if runmode is not EXECUTE
		if (runMode == RUNMODE_EXECUTE)
			m_testExecutor = new TestSessionExecutor(*m_testRoot, *m_testCtx);
		else if (runMode == RUNMODE_DUMP_STDOUT_CASELIST)
			writeCaselistsToStdout(*m_testRoot, *m_testCtx);
		else if (runMode == RUNMODE_DUMP_XML_CASELIST)
			writeXmlCaselistsToFiles(*m_testRoot, *m_testCtx, cmdLine);
		else if (runMode == RUNMODE_DUMP_TEXT_CASELIST)
			writeTxtCaselistsToFiles(*m_testRoot, *m_testCtx, cmdLine);
		else
			DE_ASSERT(false);
	}
	catch (const std::exception& e)
	{
		cleanup();
		die("Failed to initialize dEQP: %s", e.what());
	}
}